

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void google::protobuf::compiler::javanano::anon_unknown_3::LoadEnumValues
               (Params *params,EnumDescriptor *enum_descriptor,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *canonical_values)

{
  undefined8 this;
  int iVar1;
  int iVar2;
  string *input;
  EnumDescriptor *in_RCX;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  EnumValueDescriptor *local_68;
  EnumValueDescriptor *canonical_value;
  EnumValueDescriptor *value;
  int local_44;
  undefined1 local_40 [4];
  int i;
  string enum_class_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *canonical_values_local;
  EnumDescriptor *enum_descriptor_local;
  Params *params_local;
  
  enum_class_name.field_2._8_8_ = canonical_values;
  ClassName_abi_cxx11_((string *)local_40,(javanano *)params,(Params *)enum_descriptor,in_RCX);
  local_44 = 0;
  while( true ) {
    iVar2 = local_44;
    iVar1 = EnumDescriptor::value_count(enum_descriptor);
    if (iVar1 <= iVar2) break;
    canonical_value = EnumDescriptor::value(enum_descriptor,local_44);
    iVar2 = EnumValueDescriptor::number(canonical_value);
    local_68 = EnumDescriptor::FindValueByNumber(enum_descriptor,iVar2);
    this = enum_class_name.field_2._8_8_;
    if (canonical_value == local_68) {
      std::operator+(&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     ".");
      input = EnumValueDescriptor::name_abi_cxx11_(canonical_value);
      RenameJavaKeywords(&local_c8,input);
      std::operator+(&local_88,&local_a8,&local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    local_44 = local_44 + 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void LoadEnumValues(const Params& params,
    const EnumDescriptor* enum_descriptor, vector<string>* canonical_values) {
  string enum_class_name = ClassName(params, enum_descriptor);
  for (int i = 0; i < enum_descriptor->value_count(); i++) {
    const EnumValueDescriptor* value = enum_descriptor->value(i);
    const EnumValueDescriptor* canonical_value =
        enum_descriptor->FindValueByNumber(value->number());
    if (value == canonical_value) {
      canonical_values->push_back(
          enum_class_name + "." + RenameJavaKeywords(value->name()));
    }
  }
}